

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O2

void once_cb(uv_timer_t *handle)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 uStack_10;
  
  printf("ONCE_CB %d\n",(ulong)(uint)once_cb_called);
  if (handle == (uv_timer_t *)0x0) {
    pcVar3 = "handle != NULL";
    uStack_10 = 0x32;
  }
  else {
    iVar1 = uv_is_active(handle);
    if (iVar1 == 0) {
      once_cb_called = once_cb_called + 1;
      uv_close(handle,once_close_cb);
      uVar2 = uv_default_loop();
      uv_update_time(uVar2);
      return;
    }
    pcVar3 = "0 == uv_is_active((uv_handle_t*) handle)";
    uStack_10 = 0x33;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
          ,uStack_10,pcVar3);
  abort();
}

Assistant:

static void once_cb(uv_timer_t* handle) {
  printf("ONCE_CB %d\n", once_cb_called);

  ASSERT(handle != NULL);
  ASSERT(0 == uv_is_active((uv_handle_t*) handle));

  once_cb_called++;

  uv_close((uv_handle_t*)handle, once_close_cb);

  /* Just call this randomly for the code coverage. */
  uv_update_time(uv_default_loop());
}